

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_ldst_modrm(CPUX86State *env,DisasContext *s,int modrm,MemOp ot,int reg,int is_store)

{
  uint reg_00;
  int rm;
  int mod;
  int is_store_local;
  int reg_local;
  MemOp ot_local;
  int modrm_local;
  DisasContext *s_local;
  CPUX86State *env_local;
  
  reg_00 = modrm & 7U | s->rex_b;
  if ((modrm >> 6 & 3U) == 3) {
    if (is_store == 0) {
      gen_op_mov_v_reg(s,ot,s->T0,reg_00);
      if (reg != 0x10) {
        gen_op_mov_reg_v(s,ot,reg,s->T0);
      }
    }
    else {
      if (reg != 0x10) {
        gen_op_mov_v_reg(s,ot,s->T0,reg);
      }
      gen_op_mov_reg_v(s,ot,reg_00,s->T0);
    }
  }
  else {
    gen_lea_modrm(env,s,modrm);
    if (is_store == 0) {
      gen_op_ld_v(s,ot,s->T0,s->A0);
      if (reg != 0x10) {
        gen_op_mov_reg_v(s,ot,reg,s->T0);
      }
    }
    else {
      if (reg != 0x10) {
        gen_op_mov_v_reg(s,ot,s->T0,reg);
      }
      gen_op_st_v(s,ot,s->T0,s->A0);
    }
  }
  return;
}

Assistant:

static void gen_ldst_modrm(CPUX86State *env, DisasContext *s, int modrm,
                           MemOp ot, int reg, int is_store)
{
    int mod, rm;

    mod = (modrm >> 6) & 3;
    rm = (modrm & 7) | REX_B(s);
    if (mod == 3) {
        if (is_store) {
            if (reg != OR_TMP0)
                gen_op_mov_v_reg(s, ot, s->T0, reg);
            gen_op_mov_reg_v(s, ot, rm, s->T0);
        } else {
            gen_op_mov_v_reg(s, ot, s->T0, rm);
            if (reg != OR_TMP0)
                gen_op_mov_reg_v(s, ot, reg, s->T0);
        }
    } else {
        gen_lea_modrm(env, s, modrm);
        if (is_store) {
            if (reg != OR_TMP0)
                gen_op_mov_v_reg(s, ot, s->T0, reg);
            gen_op_st_v(s, ot, s->T0, s->A0);
        } else {
            gen_op_ld_v(s, ot, s->T0, s->A0);
            if (reg != OR_TMP0)
                gen_op_mov_reg_v(s, ot, reg, s->T0);
        }
    }
}